

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundoview.cpp
# Opt level: O0

void __thiscall QUndoModel::setStackCurrentIndex(QUndoModel *this,QModelIndex *index)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QUndoModel *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QModelIndex *in_stack_ffffffffffffffb8;
  QUndoModel *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x10) != 0) {
    this_00 = in_RSI;
    selectedIndex(in_RSI);
    bVar2 = ::operator==((QModelIndex *)in_RSI,in_stack_ffffffffffffffb8);
    if ((!bVar2) && (iVar3 = QModelIndex::column((QModelIndex *)this_00), iVar3 == 0)) {
      iVar3 = (int)*(undefined8 *)(in_RDI + 0x10);
      QModelIndex::row((QModelIndex *)this_00);
      QUndoStack::setIndex(iVar3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUndoModel::setStackCurrentIndex(const QModelIndex &index)
{
    if (m_stack == nullptr)
        return;

    if (index == selectedIndex())
        return;

    if (index.column() != 0)
        return;

    m_stack->setIndex(index.row());
}